

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O0

reentrant_put_transaction<void> *
density_tests::detail::
TryPutFloat<density::lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
::reentrant_put(reentrant_put_transaction<void> *__return_storage_ptr__,
               conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
               *queue,EasyRandom *i_rand)

{
  progress_guarantee i_progress_guarantee;
  EasyRandom *this;
  int iVar1;
  runtime_type local_c8;
  reentrant_put_transaction<void> local_c0;
  runtime_type local_90;
  reentrant_put_transaction<void> local_88;
  reentrant_put_transaction<float> local_68;
  reentrant_put_transaction<float> local_48;
  progress_guarantee local_28;
  float local_24;
  progress_guarantee progress_guarantee;
  float source;
  EasyRandom *i_rand_local;
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
  *queue_local;
  
  local_24 = 3.1415;
  _progress_guarantee = i_rand;
  i_rand_local = (EasyRandom *)queue;
  queue_local = (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
                 *)__return_storage_ptr__;
  local_28 = get_rand_progress_guarantee(i_rand);
  iVar1 = EasyRandom::get_int<int>(_progress_guarantee,3);
  this = i_rand_local;
  i_progress_guarantee = local_28;
  switch(iVar1) {
  case 1:
    density::
    lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
    ::try_start_reentrant_emplace<float,float&>
              (&local_68,
               (lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
                *)i_rand_local,local_28,&local_24);
    density::
    lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
    ::reentrant_put_transaction<void>::reentrant_put_transaction<float,void>
              ((reentrant_put_transaction<void> *)__return_storage_ptr__,&local_68);
    density::
    lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::reentrant_put_transaction<float>::~reentrant_put_transaction(&local_68);
    break;
  case 2:
    TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>
    ::make<float>();
    density::
    lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::try_start_reentrant_dyn_push_copy
              (&local_88,
               (lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                *)this,i_progress_guarantee,&local_90,&local_24);
    density::
    lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
    ::reentrant_put_transaction<void>::reentrant_put_transaction<void,void>
              ((reentrant_put_transaction<void> *)__return_storage_ptr__,&local_88);
    density::
    lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::reentrant_put_transaction<void>::~reentrant_put_transaction
              ((reentrant_put_transaction<void> *)&local_88);
    TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>
    ::~TestRuntimeTime(&local_90);
    break;
  case 3:
    TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>
    ::make<float>();
    density::
    lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::try_start_reentrant_dyn_push_move
              (&local_c0,
               (lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
                *)this,i_progress_guarantee,&local_c8,&local_24);
    density::
    lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
    ::reentrant_put_transaction<void>::reentrant_put_transaction<void,void>
              ((reentrant_put_transaction<void> *)__return_storage_ptr__,&local_c0);
    density::
    lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::reentrant_put_transaction<void>::~reentrant_put_transaction
              ((reentrant_put_transaction<void> *)&local_c0);
    TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>
    ::~TestRuntimeTime(&local_c8);
    break;
  default:
    assert_failed<>("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/queue_generic_tests.h"
                    ,0x109);
  case 0:
    density::
    lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
    ::try_start_reentrant_push<float&>
              (&local_48,
               (lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
                *)i_rand_local,local_28,&local_24);
    density::
    lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
    ::reentrant_put_transaction<void>::reentrant_put_transaction<float,void>
              ((reentrant_put_transaction<void> *)__return_storage_ptr__,&local_48);
    density::
    lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
    ::reentrant_put_transaction<float>::~reentrant_put_transaction(&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

static typename QUEUE::template reentrant_put_transaction<void>
              reentrant_put(QUEUE & queue, EasyRandom & i_rand)
            {
                auto       source             = s_value;
                auto const progress_guarantee = get_rand_progress_guarantee(i_rand);
                switch (i_rand.get_int(3))
                {
                default:
                    DENSITY_TEST_ASSERT(false);
                case 0:
                    return queue.try_start_reentrant_push(progress_guarantee, source);
                case 1:
                    return queue.template try_start_reentrant_emplace<float>(
                      progress_guarantee, source);
                case 2:
                    return queue.try_start_reentrant_dyn_push_copy(
                      progress_guarantee, QUEUE::runtime_type::template make<float>(), &source);
                case 3:
                    return queue.try_start_reentrant_dyn_push_move(
                      progress_guarantee, QUEUE::runtime_type::template make<float>(), &source);

                    /*case 2:
                {
                    auto put = queue.template try_start_reentrant_dyn_push(progress_guarantee,
                        QUEUE::runtime_type::template make<float>());
                    if (put)
                    {
                        *static_cast<float*>(put.element_ptr()) += source;
                    }
                    return static_cast<bool>(put);
                }*/
                }
            }